

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void done_in_by(monst *mtmp)

{
  char local_118 [8];
  char buf [256];
  monst *mtmp_local;
  
  killer_format = done_in_by_format(mtmp,local_118);
  killer = local_118;
  if (mtmp->data->mlet == '1') {
    u.ugrave_arise = 0xec;
  }
  else if ((mtmp->data->mlet == '\'') && (urace.mummynum != -1)) {
    u.ugrave_arise = (int)urace.mummynum;
  }
  else if (((mtmp->data->mlet == '0') || ((mtmp->data->mflags2 & 0x100) != 0)) &&
          (urace.malenum == 0x10b)) {
    u.ugrave_arise = 0xe8;
  }
  else if (mtmp->data == mons + 0xfd) {
    u.ugrave_arise = 0xfd;
  }
  if ((-1 < u.ugrave_arise) && ((mvitals[u.ugrave_arise].mvflags & 2) != 0)) {
    u.ugrave_arise = -1;
  }
  pline("You die...");
  if ((mtmp->data == mons + 0xc) || (mtmp->data == mons + 0xb)) {
    done(8);
  }
  else {
    done(0);
  }
  return;
}

Assistant:

void done_in_by(const struct monst *mtmp)
{
	char buf[BUFSZ];
	killer_format = done_in_by_format(mtmp, buf);
	killer = buf;

	if (mtmp->data->mlet == S_WRAITH)
		u.ugrave_arise = PM_WRAITH;
	else if (mtmp->data->mlet == S_MUMMY && urace.mummynum != NON_PM)
		u.ugrave_arise = urace.mummynum;
	else if (is_vampire(mtmp->data) && Race_if (PM_HUMAN))
		u.ugrave_arise = PM_VAMPIRE;
	else if (mtmp->data == &mons[PM_GHOUL])
		u.ugrave_arise = PM_GHOUL;
	if (u.ugrave_arise >= LOW_PM &&
				(mvitals[u.ugrave_arise].mvflags & G_GENOD))
		u.ugrave_arise = NON_PM;

	pline("You die...");
	if (touch_petrifies(mtmp->data))
		done(STONING);
	else
		done(DIED);
}